

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&>::
operator>(result *__return_storage_ptr__,
         expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&> *this
         ,char (*rhs) [6])

{
  lest *this_00;
  type rhs_00;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  char (*in_R8) [6];
  allocator local_109;
  string local_108 [32];
  basic_string_view<char,_std::char_traits<char>_> local_e8 [2];
  string local_c8;
  text local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  const_pointer local_78;
  size_type sStack_70;
  const_pointer local_68;
  size_type sStack_60;
  bool local_49;
  result local_48;
  string *local_20;
  char (*rhs_local) [6];
  expression_lhs<const_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_&>
  *this_local;
  
  local_68 = (const_pointer)**(undefined8 **)this;
  sStack_60 = (*(undefined8 **)this)[1];
  local_20 = (string *)rhs;
  rhs_local = (char (*) [6])this;
  this_local = (expression_lhs<const_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_&>
                *)__return_storage_ptr__;
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_88,*rhs);
  local_78 = local_88.data_;
  sStack_70 = local_88.size_;
  lhs.size_ = sStack_60;
  lhs.data_ = local_68;
  rhs_00.size_ = local_88.size_;
  rhs_00.data_ = local_88.data_;
  local_49 = nonstd::sv_lite::operator>(lhs,rhs_00);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,">",&local_109);
  std::__cxx11::string::string((string *)local_e8,local_108);
  to_string<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,char[6]>
            (&local_c8,this_00,local_e8,local_20,in_R8);
  std::__cxx11::string::string((string *)&local_a8,(string *)&local_c8);
  result::result<bool>(&local_48,&local_49,&local_a8);
  result::result(__return_storage_ptr__,&local_48);
  result::~result(&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }